

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcnn.cpp
# Opt level: O3

ImageVolume * __thiscall
CppCNN::normalize_examples(ImageVolume *__return_storage_ptr__,CppCNN *this,ImageVolume *examples)

{
  pointer pvVar1;
  pointer pMVar2;
  ulong uVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  pointer pvVar6;
  pointer pMVar7;
  long lVar8;
  Index index;
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"normalize_examples",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  std::
  vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
  ::vector(__return_storage_ptr__,examples);
  auVar5 = _DAT_00126070;
  pvVar6 = (__return_storage_ptr__->
           super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (__return_storage_ptr__->
           super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pvVar6 == pvVar1) {
      return __return_storage_ptr__;
    }
    pMVar2 = (pvVar6->
             super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pMVar7 = (pvVar6->
                  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pMVar7 != pMVar2; pMVar7 = pMVar7 + 1)
    {
      uVar9 = (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows;
      uVar3 = (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols;
      if ((long)(uVar3 | uVar9) < 0) {
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/CwiseNullaryOp.h"
                      ,0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                     );
      }
      pdVar4 = (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      lVar8 = uVar3 * uVar9;
      uVar9 = lVar8 - (lVar8 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < lVar8) {
        lVar10 = 0;
        do {
          auVar11 = divpd(*(undefined1 (*) [16])(pdVar4 + lVar10),auVar5);
          *(undefined1 (*) [16])(pdVar4 + lVar10) = auVar11;
          lVar10 = lVar10 + 2;
        } while (lVar10 < (long)uVar9);
      }
      if ((long)uVar9 < lVar8) {
        do {
          pdVar4[uVar9] = pdVar4[uVar9] / 255.0;
          uVar9 = uVar9 + 1;
        } while (lVar8 - uVar9 != 0);
      }
    }
    pvVar6 = pvVar6 + 1;
  } while( true );
}

Assistant:

ImageVolume CppCNN::normalize_examples(const ImageVolume& examples) {
	cout << __FUNCTION__ << endl;

	ImageVolume examples_norm = examples;
	for (auto& input : examples_norm)
		for (auto& channel : input)
			channel /= 255.0;

	return examples_norm;
}